

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPController.cpp
# Opt level: O2

void __thiscall
cppti::HTTPController::routeSpeakers(HTTPController *this,Request *param_1,Response *res)

{
  vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> *__x;
  json json;
  string_t local_48;
  vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> speakers;
  
  __x = TalksDB::getSpeakerList((this->talksdb)._M_data);
  std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>::vector
            (&speakers,__x);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<const_std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>_&,_std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>,_0>
            (&json,&speakers);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_48,&json,-1,' ',false,strict);
  httplib::Response::set_content(res,&local_48,"application/json");
  std::__cxx11::string::~string((string *)&local_48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>::~vector(&speakers)
  ;
  return;
}

Assistant:

void HTTPController::routeSpeakers(Request const&, Response& res)
{
  auto const speakers = this->talksdb.get().getSpeakerList();
  nlohmann::json const json = speakers;
  res.set_content(json.dump(), "application/json");
}